

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall QTreeView::keyboardSearch(QTreeView *this,QString *search)

{
  QPersistentModelIndex *this_00;
  QTreeViewPrivate *this_01;
  QAbstractItemModel *pQVar1;
  QTreeViewItem *pQVar2;
  uint uVar3;
  quintptr *pqVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong *puVar12;
  bool bVar13;
  uint uVar14;
  undefined1 *puVar15;
  ulong uVar16;
  long lVar17;
  long in_FS_OFFSET;
  bool bVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  uint local_ec;
  undefined8 local_d8;
  QModelIndex *pQStack_d0;
  QAbstractItemModel *local_c8;
  PrivateShared *local_b8;
  QModelIndex *pQStack_b0;
  QAbstractItemModel *local_a8;
  QString local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar1 = (this_01->super_QAbstractItemViewPrivate).model;
  this_00 = &(this_01->super_QAbstractItemViewPrivate).root;
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
  iVar9 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_58);
  if (iVar9 != 0) {
    pQVar1 = (this_01->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_78,this_00);
    iVar9 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,(QModelIndex *)&local_78);
    if (iVar9 != 0) {
      if (((this_01->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
         ((this_01->super_QAbstractItemViewPrivate).state != CollapsingState)) {
        QAbstractItemViewPrivate::interruptDelayedItemsLayout
                  (&this_01->super_QAbstractItemViewPrivate);
        (**(code **)(**(long **)&(this_01->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x8 + 0x220))();
      }
      if ((this_01->viewItems).d.size != 0) {
        puVar15 = &DAT_aaaaaaaaaaaaaaaa;
        local_78._0_4_ = -1;
        local_78._4_4_ = -1;
        uStack_70 = (QModelIndex *)0x0;
        local_68.ptr = (QAbstractItemModel *)0x0;
        QAbstractItemView::currentIndex((QModelIndex *)&local_58,(QAbstractItemView *)this);
        if ((((int)local_58._0_4_ < 0) || ((long)local_58.shared < 0)) ||
           ((QAbstractItemModel *)local_58._16_8_ == (QAbstractItemModel *)0x0)) {
          pQVar2 = (this_01->viewItems).d.ptr;
          local_68.ptr = (pQVar2->index).m.ptr;
          uVar19 = (pQVar2->index).r;
          uVar20 = (pQVar2->index).c;
          uVar21 = (undefined4)(pQVar2->index).i;
          uVar22 = *(undefined4 *)((long)&(pQVar2->index).i + 4);
        }
        else {
          QAbstractItemView::currentIndex((QModelIndex *)&local_58,(QAbstractItemView *)this);
          local_68.ptr = (QAbstractItemModel *)local_58._16_8_;
          uVar19 = local_58._0_4_;
          uVar20 = local_58._4_4_;
          uVar21 = local_58._8_4_;
          uVar22 = local_58._12_4_;
        }
        local_78 = (PrivateShared *)CONCAT44(uVar20,uVar19);
        uStack_70 = (QModelIndex *)CONCAT44(uVar22,uVar21);
        cVar8 = QElapsedTimer::isValid();
        if (cVar8 == '\0') {
          QElapsedTimer::start();
        }
        else {
          puVar15 = (undefined1 *)QElapsedTimer::restart();
        }
        if ((cVar8 == '\x01' && (search->d).size != 0) &&
           (iVar9 = QApplication::keyboardInputInterval(), (long)puVar15 <= (long)iVar9)) {
          QString::append((QString *)&(this_01->super_QAbstractItemViewPrivate).keyboardInput);
          bVar13 = false;
        }
        else {
          QString::operator=(&(this_01->super_QAbstractItemViewPrivate).keyboardInput,
                             (QString *)search);
          QAbstractItemView::currentIndex((QModelIndex *)&local_58,(QAbstractItemView *)this);
          bVar13 = (QAbstractItemModel *)local_58._16_8_ != (QAbstractItemModel *)0x0 &&
                   -1 < (int)(local_58._4_4_ | local_58._0_4_);
        }
        uVar16 = (this_01->super_QAbstractItemViewPrivate).keyboardInput.d.size;
        if (uVar16 < 2) {
          bVar18 = false;
        }
        else {
          iVar9 = QString::count((QChar)((short)this_01 + L'ϰ'),
                                 (uint)(ushort)(this_01->super_QAbstractItemViewPrivate).
                                               keyboardInput.d.ptr[uVar16 - 1]);
          bVar18 = (long)iVar9 == (this_01->super_QAbstractItemViewPrivate).keyboardInput.d.size;
          if (bVar18) {
            bVar13 = true;
          }
        }
        if (bVar13) {
          indexBelow((QModelIndex *)&local_58,this,(QModelIndex *)&local_78);
          if ((((int)local_58._0_4_ < 0) || ((long)local_58.shared < 0)) ||
             ((QAbstractItemModel *)local_58._16_8_ == (QAbstractItemModel *)0x0)) {
            pQVar2 = (this_01->viewItems).d.ptr;
            uStack_70 = (QModelIndex *)(pQVar2->index).i;
            local_68.ptr = (pQVar2->index).m.ptr;
            bVar13 = local_78._4_4_ != (pQVar2->index).c;
            local_78 = *(PrivateShared **)&pQVar2->index;
            if (bVar13) {
              if (local_68.ptr == (QAbstractItemModel *)0x0) {
                local_58._forAlignment = -NAN;
                local_58._8_8_ = (QModelIndex *)0x0;
                local_58._16_8_ = (QAbstractItemModel *)0x0;
              }
              else {
                (**(code **)(*(long *)local_68.ptr + 0x70))
                          (&local_58,local_68.ptr,(pQVar2->index).r);
              }
              local_68.ptr = (QAbstractItemModel *)local_58._16_8_;
              local_78 = local_58.shared;
              uStack_70 = (QModelIndex *)local_58._8_8_;
            }
          }
          else {
            indexBelow((QModelIndex *)&local_58,this,(QModelIndex *)&local_78);
            local_68.ptr = (QAbstractItemModel *)local_58._16_8_;
            local_78 = local_58.shared;
            uStack_70 = (QModelIndex *)local_58._8_8_;
          }
        }
        uVar10 = QTreeViewPrivate::viewIndex(this_01,(QModelIndex *)&local_78);
        if (-1 < (int)uVar10) {
          local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          if (bVar18) {
            QString::QString(&local_98,
                             (QChar)*(this_01->super_QAbstractItemViewPrivate).keyboardInput.d.ptr);
          }
          else {
            local_98.d.d = (this_01->super_QAbstractItemViewPrivate).keyboardInput.d.d;
            local_98.d.ptr = (this_01->super_QAbstractItemViewPrivate).keyboardInput.d.ptr;
            local_98.d.size = (this_01->super_QAbstractItemViewPrivate).keyboardInput.d.size;
            if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (((QArrayData *)&((local_98.d.d)->super_QArrayData).ref_)->ref_)._q_value.
              super___atomic_base<int>._M_i =
                   (((QArrayData *)&((local_98.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
          }
          if ((this_01->viewItems).d.size == 0) {
            local_ec = 0xffffffff;
            uVar14 = 0xffffffff;
          }
          else {
            uVar11 = 0xffffffff;
            lVar17 = 0x1c;
            uVar16 = 0;
            uVar14 = 0xffffffff;
            local_ec = 0xffffffff;
            do {
              pQVar2 = (this_01->viewItems).d.ptr;
              if ((int)uVar11 < (int)(uint)*(ushort *)((long)&(pQVar2->index).c + lVar17)) {
                puVar12 = (ulong *)((long)pQVar2 + lVar17 + -0x1c);
                local_b8 = (PrivateShared *)*puVar12;
                pqVar4 = (quintptr *)((long)pQVar2 + lVar17 + -0x14);
                pQStack_b0 = (QModelIndex *)*pqVar4;
                local_a8 = *(QAbstractItemModel **)((long)pQVar2 + lVar17 + -0xc);
                if (0 < local_78._4_4_) {
                  if (local_a8 == (QAbstractItemModel *)0x0) {
                    local_58._forAlignment = -NAN;
                    local_58._8_8_ = (QModelIndex *)0x0;
                    local_58._16_8_ = (QAbstractItemModel *)0x0;
                    uVar5 = local_58._forAlignment;
                    uVar6 = local_58._8_8_;
                    uVar7 = local_58._16_8_;
                  }
                  else {
                    uVar5 = (PrivateShared *)*puVar12;
                    uVar6 = (QModelIndex *)*pqVar4;
                    uVar7 = local_a8;
                    if (*(int *)((long)pQVar2 + lVar17 + -0x18) != local_78._4_4_) {
                      (**(code **)(*(long *)local_a8 + 0x70))
                                (&local_58,local_a8,(int)*puVar12,local_78._4_4_,&local_b8);
                      uVar5 = local_58._0_8_;
                      uVar6 = local_58._8_8_;
                      uVar7 = local_58._16_8_;
                    }
                  }
                  local_58._16_8_ = uVar7;
                  local_58._8_8_ = uVar6;
                  local_58.shared = (PrivateShared *)uVar5;
                  local_a8 = (QAbstractItemModel *)local_58._16_8_;
                  local_b8 = local_58.shared;
                  pQStack_b0 = (QModelIndex *)local_58._8_8_;
                }
                if (local_a8 == (QAbstractItemModel *)0x0) {
                  local_58._forAlignment = -NAN;
                  local_58._8_8_ = (QModelIndex *)0x0;
                  local_58._16_8_ = (QAbstractItemModel *)0x0;
                }
                else {
                  (**(code **)(*(long *)local_a8 + 0x68))(&local_58,local_a8,&local_b8);
                }
                if (local_68.ptr == (QAbstractItemModel *)0x0) {
                  local_d8 = (QArrayData *)0xffffffffffffffff;
                  pQStack_d0 = (QModelIndex *)0x0;
                  local_c8 = (QAbstractItemModel *)0x0;
                }
                else {
                  (**(code **)(*(long *)local_68.ptr + 0x68))(&local_d8,local_68.ptr,&local_78);
                }
                if (local_58._0_4_ == (int)local_d8) {
                  if (((local_58._4_4_ == local_d8._4_4_) &&
                      ((QModelIndex *)local_58._8_8_ == pQStack_d0)) &&
                     ((QAbstractItemModel *)local_58._16_8_ == local_c8)) {
                    local_a8 = local_68.ptr;
                    local_b8 = local_78;
                    pQStack_b0 = uStack_70;
                  }
                }
                local_c8 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
                local_d8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
                pQStack_d0 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
                pQVar1 = (this_01->super_QAbstractItemViewPrivate).model;
                ::QVariant::QVariant((QVariant *)&local_58,(QString *)&local_98);
                (**(code **)(*(long *)pQVar1 + 0x150))
                          (&local_d8,pQVar1,&local_b8,0,&local_58,1,0x22);
                ::QVariant::~QVariant((QVariant *)&local_58);
                if (local_c8 != (QAbstractItemModel *)0x0) {
                  uVar11 = QTreeViewPrivate::viewIndex(this_01,pQStack_d0);
                  if (uVar11 < uVar10) {
                    uVar3 = uVar14;
                    if ((int)uVar11 < (int)uVar14) {
                      uVar3 = uVar11;
                    }
                    bVar13 = uVar14 == 0xffffffff;
                    uVar14 = uVar3;
                    if (bVar13) {
                      uVar14 = uVar11;
                    }
                  }
                  else if ((int)uVar10 <= (int)uVar11) {
                    uVar3 = local_ec;
                    if ((int)uVar11 < (int)local_ec) {
                      uVar3 = uVar11;
                    }
                    bVar13 = local_ec == 0xffffffff;
                    local_ec = uVar3;
                    if (bVar13) {
                      local_ec = uVar11;
                    }
                  }
                }
                if (local_d8 != (QArrayData *)0x0) {
                  LOCK();
                  (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_d8,0x18,0x10);
                  }
                }
              }
              uVar11 = (uint)*(ushort *)((long)&(((this_01->viewItems).d.ptr)->index).c + lVar17);
              uVar16 = uVar16 + 1;
              lVar17 = lVar17 + 0x28;
            } while (uVar16 < (ulong)(this_01->viewItems).d.size);
          }
          local_58._forAlignment = -NAN;
          local_58._8_8_ = (QModelIndex *)0x0;
          local_58._16_8_ = (QAbstractItemModel *)0x0;
          if ((-1 < (int)local_ec) || (local_ec = uVar14, -1 < (int)uVar14)) {
            pQVar2 = (this_01->viewItems).d.ptr;
            local_58._16_8_ = pQVar2[local_ec].index.m.ptr;
            pQVar2 = pQVar2 + local_ec;
            local_58.shared = (PrivateShared *)*(undefined8 *)&pQVar2->index;
            local_58._8_8_ = (pQVar2->index).i;
          }
          if (0 < local_78._4_4_) {
            if ((QAbstractItemModel *)local_58._16_8_ == (QAbstractItemModel *)0x0) {
              local_b8 = (PrivateShared *)0xffffffffffffffff;
              pQStack_b0 = (QModelIndex *)0x0;
              local_a8 = (QAbstractItemModel *)0x0;
            }
            else if (local_58._4_4_ == local_78._4_4_) {
              local_a8 = (QAbstractItemModel *)local_58._16_8_;
              local_b8 = local_58.shared;
              pQStack_b0 = (QModelIndex *)local_58._8_8_;
            }
            else {
              (**(code **)(*(long *)local_58._16_8_ + 0x70))
                        (&local_b8,local_58._16_8_,(ulong)local_58.shared & 0xffffffff);
            }
            local_58._16_8_ = local_a8;
            local_58._0_8_ = local_b8;
            local_58._8_8_ = pQStack_b0;
          }
          if (((-1 < (int)local_58._0_4_) && (-1 < (long)local_58.shared)) &&
             ((QAbstractItemModel *)local_58._16_8_ != (QAbstractItemModel *)0x0)) {
            QAbstractItemView::setCurrentIndex((QAbstractItemView *)this,(QModelIndex *)&local_58);
          }
          if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::keyboardSearch(const QString &search)
{
    Q_D(QTreeView);
    if (!d->model->rowCount(d->root) || !d->model->columnCount(d->root))
        return;

    // Do a relayout nows, so that we can utilize viewItems
    d->executePostedLayout();
    if (d->viewItems.isEmpty())
        return;

    QModelIndex start;
    if (currentIndex().isValid())
        start = currentIndex();
    else
        start = d->viewItems.at(0).index;

    bool skipRow = false;
    bool keyboardTimeWasValid = d->keyboardInputTime.isValid();
    qint64 keyboardInputTimeElapsed;
    if (keyboardTimeWasValid)
        keyboardInputTimeElapsed = d->keyboardInputTime.restart();
    else
        d->keyboardInputTime.start();
    if (search.isEmpty() || !keyboardTimeWasValid
        || keyboardInputTimeElapsed > QApplication::keyboardInputInterval()) {
        d->keyboardInput = search;
        skipRow = currentIndex().isValid(); //if it is not valid we should really start at QModelIndex(0,0)
    } else {
        d->keyboardInput += search;
    }

    // special case for searches with same key like 'aaaaa'
    bool sameKey = false;
    if (d->keyboardInput.size() > 1) {
        int c = d->keyboardInput.count(d->keyboardInput.at(d->keyboardInput.size() - 1));
        sameKey = (c == d->keyboardInput.size());
        if (sameKey)
            skipRow = true;
    }

    // skip if we are searching for the same key or a new search started
    if (skipRow) {
        if (indexBelow(start).isValid()) {
            start = indexBelow(start);
        } else {
            const int origCol = start.column();
            start = d->viewItems.at(0).index;
            if (origCol != start.column())
                start = start.sibling(start.row(), origCol);
        }
    }

    int startIndex = d->viewIndex(start);
    if (startIndex <= -1)
        return;

    int previousLevel = -1;
    int bestAbove = -1;
    int bestBelow = -1;
    QString searchString = sameKey ? QString(d->keyboardInput.at(0)) : d->keyboardInput;
    for (int i = 0; i < d->viewItems.size(); ++i) {
        if ((int)d->viewItems.at(i).level > previousLevel) {
            QModelIndex searchFrom = d->viewItems.at(i).index;
            if (start.column() > 0)
                searchFrom = searchFrom.sibling(searchFrom.row(), start.column());
            if (searchFrom.parent() == start.parent())
                searchFrom = start;
            QModelIndexList match = d->model->match(searchFrom, Qt::DisplayRole, searchString);
            if (match.size()) {
                int hitIndex = d->viewIndex(match.at(0));
                if (hitIndex >= 0 && hitIndex < startIndex)
                    bestAbove = bestAbove == -1 ? hitIndex : qMin(hitIndex, bestAbove);
                else if (hitIndex >= startIndex)
                    bestBelow = bestBelow == -1 ? hitIndex : qMin(hitIndex, bestBelow);
            }
        }
        previousLevel = d->viewItems.at(i).level;
    }

    QModelIndex index;
    if (bestBelow > -1)
        index = d->viewItems.at(bestBelow).index;
    else if (bestAbove > -1)
        index = d->viewItems.at(bestAbove).index;

    if (start.column() > 0)
        index = index.sibling(index.row(), start.column());

    if (index.isValid())
        setCurrentIndex(index);
}